

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brightness_ctrl.cpp
# Opt level: O0

void __thiscall BrightnessControl::_brightness_slide(BrightnessControl *this,int p)

{
  int iVar1;
  bool bVar2;
  value_type *pvVar3;
  double dVar4;
  int local_4c;
  duration<long,_std::ratio<1L,_1000L>_> local_48 [3];
  double local_30;
  double dd;
  int d;
  int pbr;
  lock_guard<std::mutex> adjust_lck;
  int p_local;
  BrightnessControl *this_local;
  
  adjust_lck._M_device._4_4_ = p;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&d,&this->adjust_m);
  adjust_lck._M_device._4_4_ = this->offset + adjust_lck._M_device._4_4_;
  if (100 < adjust_lck._M_device._4_4_) {
    adjust_lck._M_device._4_4_ = 100;
  }
  if (adjust_lck._M_device._4_4_ < 0) {
    adjust_lck._M_device._4_4_ = 0;
  }
  dd._4_4_ = (this->maxbr * adjust_lck._M_device._4_4_) / 100;
  if ((int)dd._4_4_ < this->minabr) {
    dd._4_4_ = this->minabr;
  }
  fprintf(_stderr,"%c: brightness adjust: %d->%d/%d\n",0x49,(ulong)(uint)this->br,(ulong)dd._4_4_,
          (ulong)(uint)this->maxbr);
  dd._0_4_ = 1;
  if ((int)dd._4_4_ < this->br) {
    dd._0_4_ = -1;
  }
  local_30 = 1.0;
  do {
    if (dd._0_4_ < 1) {
LAB_0011fb4d:
      bVar2 = false;
      if (dd._0_4_ < 0) {
        iVar1 = this->br;
        dVar4 = round((double)dd._0_4_ * local_30);
        bVar2 = (double)(int)dd._4_4_ <= (double)iVar1 + dVar4;
      }
    }
    else {
      iVar1 = this->br;
      dVar4 = round((double)dd._0_4_ * local_30);
      bVar2 = true;
      if ((double)(int)dd._4_4_ < (double)iVar1 + dVar4) goto LAB_0011fb4d;
    }
    if (!bVar2) {
      this->br = dd._4_4_;
      pvVar3 = std::filesystem::__cxx11::path::c_str(&this->brpath);
      writeint(pvVar3,this->br);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&d);
      return;
    }
    dVar4 = round((double)dd._0_4_ * local_30);
    this->br = this->br + (int)dVar4;
    pvVar3 = std::filesystem::__cxx11::path::c_str(&this->brpath);
    writeint(pvVar3,this->br);
    local_30 = local_30 * 1.2;
    local_4c = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)local_48,&local_4c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_48);
  } while( true );
}

Assistant:

void BrightnessControl::_brightness_slide(int p)
{
	std::lock_guard<std::mutex> adjust_lck(adjust_m);
	p+=offset;
	if(p>100)p=100;
	if(p<0)p=0;
	int pbr=maxbr*p/100;
	if(pbr<minabr)pbr=minabr;
	LOG('I',"brightness adjust: %d->%d/%d",br,pbr,maxbr);
	int d=1;if(pbr<br)d=-1;double dd=1;
	while(d>0&&br+round(d*dd)<=pbr||d<0&&br+round(d*dd)>=pbr)
	{
		br+=(int)round(d*dd);writeint(brpath.c_str(),br);
		dd=dd*1.2;std::this_thread::sleep_for(std::chrono::milliseconds(10));
	}
	br=pbr;writeint(brpath.c_str(),br);
}